

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_flbi.c
# Opt level: O3

char * cmime_flbi_scan_postface(char *s,CMimeMessage_T *msg)

{
  size_t sVar1;
  void *pvVar2;
  int iVar3;
  _BoundaryInfo_T *__ptr;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  _BoundaryInfo_T *__ptr_00;
  CMimeListElem_T *pCVar7;
  char *pcVar8;
  int iVar9;
  bool bVar10;
  char *local_60;
  int local_58;
  char *local_38;
  
  local_38 = strstr(s,"--");
  if (local_38 != (char *)0x0) {
    iVar9 = 0;
    local_60 = (char *)0x0;
    do {
      __ptr = _cmime_internal_get_boundary_info(msg->boundaries,local_38,msg->linebreak);
      if (__ptr != (_BoundaryInfo_T *)0x0) {
        if (__ptr->type == CMIME_BOUNDARY_CLOSE) {
          if (iVar9 == 0) {
            sVar4 = strlen(s);
            sVar5 = strlen(local_38);
            sVar4 = (size_t)((int)sVar4 - (int)sVar5);
            local_60 = (char *)calloc(sVar4 + 1,1);
            strncpy(local_60,s,sVar4);
            sVar4 = strlen(local_60);
            local_60[sVar4] = '\0';
            iVar9 = 1;
          }
          pcVar8 = local_38 + __ptr->len;
          pcVar6 = strstr(pcVar8,"--");
          if (pcVar6 == (char *)0x0) {
            sVar4 = strlen(s);
            sVar5 = strlen(pcVar8);
            local_58 = (int)sVar4 - (int)sVar5;
            local_38 = pcVar8;
          }
          else {
            __ptr_00 = _cmime_internal_get_boundary_info(msg->boundaries,pcVar6,msg->linebreak);
            if (__ptr_00 == (_BoundaryInfo_T *)0x0) {
              sVar4 = strlen(s);
              sVar5 = strlen(local_38);
              local_58 = (int)sVar4 - (int)sVar5;
            }
            else {
              sVar1 = __ptr_00->len;
              sVar4 = strlen(local_38 + sVar1);
              sVar5 = strlen(pcVar6);
              local_58 = (int)sVar4 - (int)sVar5;
              free(__ptr_00->marker);
              free(__ptr_00);
              local_38 = local_38 + sVar1;
            }
          }
          pCVar7 = msg->parts->tail;
          if (pCVar7 != (CMimeListElem_T *)0x0) {
            pcVar6 = __ptr->marker;
            do {
              pvVar2 = pCVar7->data;
              pcVar8 = *(char **)((long)pvVar2 + 0x18);
              if (pcVar8 != (char *)0x0) {
                sVar4 = strlen(pcVar8);
                iVar3 = strncmp(pcVar8,pcVar6 + 2,sVar4);
                bVar10 = iVar3 == 0;
                pcVar8 = *(char **)((long)pvVar2 + 0x10);
                if (pcVar8 != (char *)0x0) goto LAB_0010636f;
                if (iVar3 != 0) goto LAB_0010638e;
LAB_001063ae:
                if (*(void **)((long)pvVar2 + 0x20) != (void *)0x0) {
                  free(*(void **)((long)pvVar2 + 0x20));
                }
                pcVar6 = (char *)calloc((long)local_58 + 1,1);
                strncpy(pcVar6,local_38,(long)local_58);
                sVar4 = strlen(pcVar6);
                pcVar6[sVar4] = '\0';
                *(char **)((long)pvVar2 + 0x20) = pcVar6;
                *(undefined2 *)((long)pvVar2 + 0x28) = 1;
                break;
              }
              pcVar8 = *(char **)((long)pvVar2 + 0x10);
              if (pcVar8 != (char *)0x0) {
                bVar10 = false;
LAB_0010636f:
                sVar4 = strlen(pcVar8);
                iVar3 = strncmp(pcVar8,pcVar6 + 2,sVar4);
                if ((iVar3 == 0) || (bVar10)) goto LAB_001063ae;
              }
LAB_0010638e:
              pCVar7 = pCVar7->prev;
            } while (pCVar7 != (_CMimeListElem *)0x0);
          }
        }
        iVar9 = iVar9 + 1;
        free(__ptr->marker);
        free(__ptr);
      }
      local_38 = strstr(local_38 + 1,"--");
    } while (local_38 != (char *)0x0);
    if (local_60 != (char *)0x0) {
      return local_60;
    }
  }
  pcVar6 = strdup(s);
  return pcVar6;
}

Assistant:

char *cmime_flbi_scan_postface(char *s, CMimeMessage_T *msg) {
    char *it = s;
    _BoundaryInfo_T *info = NULL;
    char *boundary;
    char *postface = NULL;
    char *nxt = NULL;
    _BoundaryInfo_T *nxt_info = NULL;
    char *t = NULL;
    int count;
    int offset = 0;
    CMimeListElem_T *elem = NULL;
    CMimePart_T *part = NULL;
    int match = 0;

    count = 0;
    while((it = strstr(it,"--"))!=NULL) {
        info = _cmime_internal_get_boundary_info(msg->boundaries,it,msg->linebreak);
        if (info!=NULL) {
            //len = strlen(marker);
            //if ((marker[len-2]=='-')&&(marker[len-1]=='-')) {
            if (info->type == CMIME_BOUNDARY_CLOSE) {
                if (count == 0) {
                    offset = strlen(s) - strlen(it);
                    postface = (char *)calloc(offset + sizeof(char),sizeof(char));
                    strncpy(postface,s,offset);
                    postface[strlen(postface)] = '\0';
                    count++;
                } 
                nxt = it + info->len;
                if ((nxt = strstr(nxt,"--"))!=NULL) { 
                    if ((nxt_info = _cmime_internal_get_boundary_info(msg->boundaries,nxt,msg->linebreak))!=NULL) {  
                        it = it + nxt_info->len;
                        offset = strlen(it) - strlen(nxt); 
                        free(nxt_info->marker);
                        free(nxt_info);
                        nxt_info = NULL;
                    } else
                        offset = strlen(s) - strlen(it);
                } else {
                    it = it + info->len;
                    offset = strlen(s) - strlen(it);
                }

                /* jump over 2 starting - chars for boundary comparsion */
                boundary = info->marker;
                boundary += 2 * sizeof(char);
                /* find mime part which belongs to this boundary */
                elem = cmime_list_tail(msg->parts);
                while(elem!=NULL) {
                    part = (CMimePart_T *)cmime_list_data(elem);
                    match = 0;
                    if (part->parent_boundary!=NULL) {
                        if (strncmp(part->parent_boundary,boundary,strlen(part->parent_boundary))==0) 
                            match = 1;
                    }

                    if (part->boundary!=NULL) {
                        if (strncmp(part->boundary,boundary,strlen(part->boundary))==0) 
                            match = 1;
                    }
                    
                    if (match == 1) {
                        if (part->postface!=NULL)
                            free(part->postface);

                        t = (char *)calloc(offset + sizeof(char),sizeof(char));
                        strncpy(t,it,offset);
                        t[strlen(t)] = '\0';
                        part->postface = t;
                        part->last = 1;
                        break;
                   } 
                    
                    elem = elem->prev;
                }
            }
            count++;
            free(info->marker);
            free(info);
            info = NULL;
        }
        
        it++;
    }
    
    if (postface==NULL)
        postface = strdup(s);
    return(postface);
}